

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ring_buffer.c
# Opt level: O0

size_t WebRtc_ReadBuffer(RingBuffer *self,void **data_ptr,void *data,size_t element_count)

{
  RingBuffer *pRVar1;
  size_t read_count;
  size_t buf_ptr_bytes_2;
  size_t buf_ptr_bytes_1;
  void *buf_ptr_2;
  void *buf_ptr_1;
  size_t element_count_local;
  void *data_local;
  void **data_ptr_local;
  RingBuffer *self_local;
  
  if (self == (RingBuffer *)0x0) {
    self_local = (RingBuffer *)0x0;
  }
  else if (data == (void *)0x0) {
    self_local = (RingBuffer *)0x0;
  }
  else {
    buf_ptr_2 = (void *)0x0;
    buf_ptr_bytes_1 = 0;
    buf_ptr_bytes_2 = 0;
    read_count = 0;
    buf_ptr_1 = (void *)element_count;
    element_count_local = (size_t)data;
    data_local = data_ptr;
    data_ptr_local = (void **)self;
    pRVar1 = (RingBuffer *)
             GetBufferReadRegions
                       (self,element_count,&buf_ptr_2,&buf_ptr_bytes_2,(void **)&buf_ptr_bytes_1,
                        &read_count);
    if (read_count == 0) {
      if (data_local == (void *)0x0) {
        memcpy((void *)element_count_local,buf_ptr_2,buf_ptr_bytes_2);
      }
    }
    else {
      memcpy((void *)element_count_local,buf_ptr_2,buf_ptr_bytes_2);
      memcpy((void *)(element_count_local + buf_ptr_bytes_2),(void *)buf_ptr_bytes_1,read_count);
      buf_ptr_2 = (void *)element_count_local;
    }
    if (data_local != (void *)0x0) {
      *(void **)data_local = buf_ptr_2;
    }
    WebRtc_MoveReadPtr((RingBuffer *)data_ptr_local,(int)pRVar1);
    self_local = pRVar1;
  }
  return (size_t)self_local;
}

Assistant:

size_t WebRtc_ReadBuffer(RingBuffer* self,
                         void** data_ptr,
                         void* data,
                         size_t element_count) {

  if (self == NULL) {
    return 0;
  }
  if (data == NULL) {
    return 0;
  }

  {
    void* buf_ptr_1 = NULL;
    void* buf_ptr_2 = NULL;
    size_t buf_ptr_bytes_1 = 0;
    size_t buf_ptr_bytes_2 = 0;
    const size_t read_count = GetBufferReadRegions(self,
                                                   element_count,
                                                   &buf_ptr_1,
                                                   &buf_ptr_bytes_1,
                                                   &buf_ptr_2,
                                                   &buf_ptr_bytes_2);

    if (buf_ptr_bytes_2 > 0) {
      // We have a wrap around when reading the buffer. Copy the buffer data to
      // |data| and point to it.
      memcpy(data, buf_ptr_1, buf_ptr_bytes_1);
      memcpy(((char*) data) + buf_ptr_bytes_1, buf_ptr_2, buf_ptr_bytes_2);
      buf_ptr_1 = data;
    } else if (!data_ptr) {
      // No wrap, but a memcpy was requested.
      memcpy(data, buf_ptr_1, buf_ptr_bytes_1);
    }
    if (data_ptr) {
      // |buf_ptr_1| == |data| in the case of a wrap.
      *data_ptr = buf_ptr_1;
    }

    // Update read position
    WebRtc_MoveReadPtr(self, (int) read_count);

    return read_count;
  }
}